

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::anon_unknown_37::FailureTest::~FailureTest(FailureTest *this)

{
  FailureTest *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__FailureTest_001cd3c0;
  std::__cxx11::string::~string((string *)&this->error_message_);
  CodeLocation::~CodeLocation(&this->loc_);
  Test::~Test(&this->super_Test);
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}